

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O1

void __thiscall xs::posix::CaseListWriter::run(CaseListWriter *this)

{
  pointer pcVar1;
  bool bVar2;
  deFileResult dVar3;
  long lVar4;
  long bufSize;
  long lVar5;
  deInt64 numWritten;
  deInt64 local_20;
  
  lVar5 = 0;
  do {
    if (this->m_run != true) {
      return;
    }
    pcVar1 = (this->m_caseList).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_caseList).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    bufSize = lVar4 - lVar5;
    if (bufSize == 0 || lVar4 < lVar5) {
      return;
    }
    local_20 = 0;
    dVar3 = deFile_write(this->m_file,pcVar1 + lVar5,bufSize,&local_20);
    if (dVar3 == DE_FILERESULT_WOULD_BLOCK) {
      deSleep(1);
LAB_001126e2:
      bVar2 = true;
    }
    else {
      if (dVar3 == DE_FILERESULT_SUCCESS) {
        lVar5 = lVar5 + local_20;
        goto LAB_001126e2;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void CaseListWriter::run (void)
{
	deInt64 pos = 0;

	while (m_run && pos < (deInt64)m_caseList.size())
	{
		deInt64			numWritten	= 0;
		deFileResult	result		= deFile_write(m_file, &m_caseList[0] + pos, m_caseList.size()-pos, &numWritten);

		if (result == DE_FILERESULT_SUCCESS)
			pos += numWritten;
		else if (result == DE_FILERESULT_WOULD_BLOCK)
			deSleep(1); // Yield.
		else
			break; // Error.
	}
}